

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O1

bool __thiscall
HighsMipSolverData::interruptFromCallbackWithData
          (HighsMipSolverData *this,int callback_type,double mipsolver_objective_value,
          string *message)

{
  HighsCallback *this_00;
  pointer pcVar1;
  bool bVar2;
  string local_40;
  
  bVar2 = HighsCallback::callbackActive(this->mipsolver->callback_,callback_type);
  if (bVar2) {
    setCallbackDataOut(this,mipsolver_objective_value);
    this_00 = this->mipsolver->callback_;
    pcVar1 = (message->_M_dataplus)._M_p;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,pcVar1,pcVar1 + message->_M_string_length);
    bVar2 = HighsCallback::callbackAction(this_00,callback_type,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool HighsMipSolverData::interruptFromCallbackWithData(
    const int callback_type, const double mipsolver_objective_value,
    const std::string message) const {
  if (!mipsolver.callback_->callbackActive(callback_type)) return false;
  assert(!mipsolver.submip);
  setCallbackDataOut(mipsolver_objective_value);
  return mipsolver.callback_->callbackAction(callback_type, message);
}